

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

String * __thiscall
asl::String::replace(String *__return_storage_ptr__,String *this,String *a,String *b)

{
  uint uVar1;
  char *pcVar2;
  anon_union_16_2_78e7fdac_for_String_2 *paVar3;
  int n;
  anon_union_16_2_78e7fdac_for_String_2 *paVar4;
  long lVar5;
  uint j;
  undefined8 b_00;
  anon_union_16_2_78e7fdac_for_String_2 *local_78;
  String local_68;
  anon_union_16_2_78e7fdac_for_String_2 *local_50;
  anon_union_16_2_78e7fdac_for_String_2 *local_48;
  long local_40;
  anon_union_16_2_78e7fdac_for_String_2 *local_38;
  
  local_38 = &a->field_2;
  paVar3 = local_38;
  if (a->_size != 0) {
    paVar3 = (anon_union_16_2_78e7fdac_for_String_2 *)(a->field_2)._str;
  }
  local_78 = &this->field_2;
  paVar4 = local_78;
  if (this->_size != 0) {
    paVar4 = (anon_union_16_2_78e7fdac_for_String_2 *)(this->field_2)._str;
  }
  pcVar2 = strstr(paVar4->_space,paVar3->_space);
  j = (int)pcVar2 - (int)paVar4;
  n = this->_len;
  if (pcVar2 == (char *)0x0 || j == 0xffffffff) {
    alloc(__return_storage_ptr__,n);
    __return_storage_ptr__->_len = n;
    if (__return_storage_ptr__->_size == 0) {
      paVar3 = &__return_storage_ptr__->field_2;
    }
    else {
      paVar3 = (anon_union_16_2_78e7fdac_for_String_2 *)(__return_storage_ptr__->field_2)._str;
    }
    if (this->_size != 0) {
      local_78 = (anon_union_16_2_78e7fdac_for_String_2 *)(this->field_2)._str;
    }
    memcpy(paVar3,local_78,(long)n + 1);
  }
  else {
    local_40 = (long)a->_len;
    if (n < 1) {
      n = 0;
    }
    alloc(__return_storage_ptr__,n);
    __return_storage_ptr__->_len = 0;
    local_50 = &__return_storage_ptr__->field_2;
    paVar3 = local_50;
    if (__return_storage_ptr__->_size != 0) {
      paVar3 = (anon_union_16_2_78e7fdac_for_String_2 *)(__return_storage_ptr__->field_2)._str;
    }
    paVar3->_space[0] = '\0';
    substring(&local_68,this,0,j);
    b_00 = local_68.field_2._str;
    if (local_68._size == 0) {
      b_00 = &local_68.field_2;
    }
    append(__return_storage_ptr__,(char *)b_00,local_68._len);
    if (local_68._size != 0) {
      ::free(local_68.field_2._str);
    }
    local_48 = &b->field_2;
    while( true ) {
      lVar5 = (int)j + local_40;
      uVar1 = this->_len;
      if ((int)uVar1 < (int)lVar5) break;
      paVar3 = local_38;
      if (a->_size != 0) {
        paVar3 = (anon_union_16_2_78e7fdac_for_String_2 *)(a->field_2)._str;
      }
      paVar4 = local_78;
      if (this->_size != 0) {
        paVar4 = (anon_union_16_2_78e7fdac_for_String_2 *)(this->field_2)._str;
      }
      pcVar2 = strstr(paVar4->_space + lVar5,paVar3->_space);
      paVar3 = local_48;
      if (b->_size != 0) {
        paVar3 = (anon_union_16_2_78e7fdac_for_String_2 *)(b->field_2)._str;
      }
      append(__return_storage_ptr__,paVar3->_space,b->_len);
      j = -(uint)(pcVar2 == (char *)0x0) | (int)pcVar2 - (int)paVar4;
      if (j == 0xffffffff) {
        j = uVar1;
      }
      paVar3 = local_78;
      if (this->_size != 0) {
        paVar3 = (anon_union_16_2_78e7fdac_for_String_2 *)(this->field_2)._str;
      }
      append(__return_storage_ptr__,paVar3->_space + lVar5,j - (int)lVar5);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String String::replace(const String& a, const String& b) const
{
	int j = indexOf(a), m = a.length();
	if(j==-1)
		return *this;
	String out(length(), 0);
	out << substring(0, j);
	for(int i=j+m; i<=length(); i=j+m)
	{
		j = indexOf(a, i);
		if(j==-1) j=length();
		out << b;
		out.append(str() + i, j - i);
	}
	return out;
}